

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

QByteArray * __thiscall QRingChunk::toByteArray(QRingChunk *this)

{
  bool bVar1;
  QByteArray *pQVar2;
  QRingChunk *in_RSI;
  QByteArray *in_RDI;
  QByteArray *in_stack_ffffffffffffffc8;
  QByteArray *in_stack_ffffffffffffffd0;
  QByteArray *this_00;
  
  this_00 = in_RDI;
  if (in_RSI->headOffset == 0) {
    in_stack_ffffffffffffffd0 = (QByteArray *)in_RSI->tailOffset;
    pQVar2 = (QByteArray *)QByteArray::size(&in_RSI->chunk);
    if (in_stack_ffffffffffffffd0 == pQVar2) goto LAB_0062b7b0;
  }
  bVar1 = isShared((QRingChunk *)0x62b75a);
  if (bVar1) {
    head(in_RSI);
    size(in_RSI);
    QByteArray::sliced(this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffffd0);
    return this_00;
  }
  QByteArray::resize(this_00,(qsizetype)in_RDI);
  QByteArray::remove(&in_RSI->chunk,(char *)0x0);
LAB_0062b7b0:
  QByteArray::QByteArray(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return this_00;
}

Assistant:

QByteArray QRingChunk::toByteArray() &&
{
    // ### Replace with std::move(chunk).sliced(head(), size()) once sliced()&& is available
    if (headOffset != 0 || tailOffset != chunk.size()) {
        if (isShared())
            return chunk.sliced(head(), size());

        chunk.resize(tailOffset);
        chunk.remove(0, headOffset);
    }

    return std::move(chunk);
}